

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_brodnik.h
# Opt level: O0

uchar * __thiscall
vector_brodnik<unsigned_char_*>::operator[](vector_brodnik<unsigned_char_*> *this,size_t index)

{
  int iVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  size_type sVar8;
  const_reference pppuVar9;
  int local_54;
  size_t p;
  size_t e;
  size_t b;
  uint msbit;
  uint k;
  size_t r;
  size_t index_local;
  vector_brodnik<unsigned_char_*> *this_local;
  
  sVar5 = size(this);
  if (sVar5 <= index) {
    __assert_fail("index < size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/vector_brodnik.h"
                  ,0x65,
                  "T vector_brodnik<unsigned char *>::operator[](size_t) const [T = unsigned char *]"
                 );
  }
  uVar6 = index + 0x40;
  uVar4 = 0x1f;
  uVar3 = (uint)uVar6;
  if (uVar3 != 0) {
    for (; uVar3 >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  uVar4 = 0x1f - (uVar4 ^ 0x1f);
  iVar1 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  cVar2 = (char)uVar4;
  uVar7 = (uVar6 & (1 << (0x1f - ((byte)iVar1 ^ 0x1f) & 0x1f) ^ 0xffffffff)) >>
          (cVar2 - (char)(uVar4 >> 1) & 0x3fU);
  if ((uVar4 & 1) == 0) {
    local_54 = 1 << ((char)(uVar4 >> 1) + 1U & 0x1f);
  }
  else {
    local_54 = (1 << ((byte)(uVar4 >> 1) & 0x1f)) * 3;
  }
  local_54 = local_54 + -2;
  sVar8 = std::vector<unsigned_char_**,_std::allocator<unsigned_char_**>_>::size
                    (&this->_index_block);
  if (((long)local_54 + uVar7) - 0xe < sVar8) {
    pppuVar9 = std::vector<unsigned_char_**,_std::allocator<unsigned_char_**>_>::operator[]
                         (&this->_index_block,((long)local_54 + uVar7) - 0xe);
    return (*pppuVar9)
           [((0xffffffffffffffffU >> (cVar2 - (char)(uVar4 >> 1) & 0x3fU)) <<
             (cVar2 - (char)(uVar4 >> 1) & 0x3fU) ^ 0xffffffffffffffff) & uVar6];
  }
  __assert_fail("(p+b-SkippedDatablocks) < _index_block.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/vector_brodnik.h"
                ,0x76,
                "T vector_brodnik<unsigned char *>::operator[](size_t) const [T = unsigned char *]")
  ;
}

Assistant:

T operator[](size_t index) const
	{
		// See the paper for details.
		assert(index < size());
		const size_t r = index+1+SkippedElements;
		const unsigned k = 31 - __builtin_clz(r);
		const unsigned msbit = 1 << (31 - __builtin_clz(r));
		const size_t b = (r & ~msbit) >> (k-k/2);
		const size_t e = ~((~size_t(0) >> (k-k/2)) << (k-k/2)) & r;
		const size_t p = k&1 ? (3*(1<<(k>>1))-2) : ((1<<((k>>1)+1))-2);
		/*
		std::cerr<<__func__<<"\n"
			<<"\tindex="<<index<<"\n"
			<<"\tr    ="<<r<<"\n"
			<<"\tk    ="<<k<<"\n"
			<<"\tmsbit="<<msbit<<"\n"
			<<"\tb    ="<<b<<"\n"
			<<"\te    ="<<e<<"\n"
			<<"\tp    ="<<p<<"\n\n";
		*/
		assert((p+b-SkippedDatablocks) < _index_block.size());
		return _index_block[p+b-SkippedDatablocks][e];
	}